

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall BmsNoteManager::SRandom(BmsNoteManager *this,uint seed,int s,int e)

{
  barindex bar;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference piVar4;
  long lVar5;
  BmsNote *local_3e8;
  byte local_3d9;
  BmsNote *local_3a0;
  int local_384;
  int local_380;
  int c_2;
  int newlane;
  BmsWord BStack_374;
  BmsNote currentnote;
  int local_350;
  int c_1;
  int c;
  int attempt;
  BmsNote currentrow [20];
  bool iscurrent [20];
  iterator iStack_a8;
  barindex row;
  _Self local_a0;
  iterator it;
  bool isln [20];
  undefined8 local_78;
  bool isprev [20];
  undefined1 local_58 [8];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  int failure;
  int keycount;
  int e_local;
  int s_local;
  uint seed_local;
  BmsNoteManager *this_local;
  
  srand(seed);
  iVar2 = (e - s) + 1;
  notemap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  GetNoteExistBar(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  memset(&local_78,0,0x14);
  memset(&it,0,0x14);
  local_a0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  do {
    iStack_a8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
    bVar1 = std::operator!=(&local_a0,&stack0xffffffffffffff58);
    if (!bVar1) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
      return;
    }
    piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&local_a0);
    bar = *piVar4;
    memset(&currentrow[0x13].status,0,0x14);
    local_3a0 = (BmsNote *)&c;
    do {
      BmsNote::BmsNote(local_3a0);
      local_3a0 = local_3a0 + 1;
      local_350 = s;
    } while (local_3a0 != (BmsNote *)&currentrow[0x13].status);
    for (; currentnote._28_4_ = s, local_350 <= e; local_350 = local_350 + 1) {
      (&c)[(long)local_350 * 8] = 0;
    }
    for (; local_384 = s, (int)currentnote._28_4_ <= e; currentnote._28_4_ = currentnote._28_4_ + 1)
    {
      c_1 = 0;
      BmsNoteLane::Get((BmsNote *)&newlane,this->lanes_ + (int)currentnote._28_4_,bar);
      if (newlane != 0) {
        iVar3 = rand();
        while( true ) {
          local_380 = iVar3 % iVar2 + s;
          local_3d9 = 1;
          if ((isln[(long)local_380 + -8] & 1U) == 0) {
            local_3d9 = *(byte *)((long)&currentrow[0x13].status + (long)local_380);
          }
          if ((local_3d9 & 1) == 0) break;
          iVar3 = (local_380 - s) + 1;
          c_1 = c_1 + 1;
          if (iVar2 < c_1) {
            __assert_fail("attempt <= keycount",
                          "/workspace/llm4binary/github/license_c_cmakelists/kuna[P]bmsbelplus/bmsbel/bms_note.cpp"
                          ,0x11b,"void BmsNoteManager::SRandom(unsigned int, int, int)");
          }
        }
        lVar5 = (long)local_380;
        currentrow[lVar5].value = (BmsWord)currentnote.value.value_;
        currentrow[lVar5].time = currentnote.time;
        *(undefined8 *)&currentrow[lVar5].field_0xc = currentnote._12_8_;
        *(ulong *)(&c + lVar5 * 8) = CONCAT44(BStack_374.value_,newlane);
        currentrow[lVar5].type = currentnote.type;
        currentrow[lVar5].value = (BmsWord)currentnote.value.value_;
        if (newlane == 2) {
          isln[(long)local_380 + -8] = true;
        }
        else if (newlane == 3) {
          isln[(long)local_380 + -8] = false;
        }
        *(undefined1 *)((long)&currentrow[0x13].status + (long)local_380) = 1;
      }
      BmsNote::~BmsNote((BmsNote *)&newlane);
    }
    for (; local_384 <= e; local_384 = local_384 + 1) {
      BmsNoteLane::Delete(this->lanes_ + local_384,bar);
      if ((&c)[(long)local_384 * 8] != 0) {
        BmsNoteLane::Set(this->lanes_ + local_384,bar,(BmsNote *)(&c + (long)local_384 * 8));
      }
    }
    local_78._0_4_ = currentrow[0x13].status;
    local_78._4_4_ = currentrow[0x13]._28_4_;
    local_3e8 = (BmsNote *)&currentrow[0x13].status;
    do {
      local_3e8 = local_3e8 + -1;
      BmsNote::~BmsNote(local_3e8);
    } while (local_3e8 != (BmsNote *)&c);
    std::_Rb_tree_const_iterator<int>::operator++(&local_a0);
  } while( true );
}

Assistant:

void BmsNoteManager::SRandom(unsigned int seed, int s, int e) {
	// similar to HRandom
	// prepare
	srand(seed);
	int keycount = e - s + 1;
	int failure = 0;			// failed notecount to randomize
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	// start to iterate all bars
	bool isprev[_MAX_NOTE_LANE] = { false, };	// is there any note placed previously?
	bool isln[_MAX_NOTE_LANE] = { false, };		// is there occupying longnote currently?
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex row = *it;
		bool iscurrent[_MAX_NOTE_LANE] = { false, };
		BmsNote currentrow[_MAX_NOTE_LANE];
		int attempt = 0;
		// initalize row data
		for (int c = s; c <= e; c++) {
			currentrow[c].type = BmsNote::NOTE_NONE;
		}
		// make new row data
		for (int c = s; c <= e; c++) {
			attempt = 0;
			// check previous note data to check valid
			BmsNote currentnote = lanes_[c].Get(row);
			if (currentnote.type == BmsNote::NOTE_NONE) continue;

			/*
			 * find new lane to place note
			 * only difference(from HRANDOM) is here:
			 * we don't check isprev[] (is previously note existed?)
			 */
			int newlane = rand() % keycount + s;
			while (isln[newlane] || iscurrent[newlane]) {
				newlane = (newlane - s + 1) % keycount + s;
				attempt++;
				_ASSERT(attempt <= keycount);	// this shouldn't happen
			}
			// copy previous note data to new temp row
			currentrow[newlane] = currentnote;
			switch (currentnote.type) {
			case BmsNote::NOTE_LNSTART:
				isln[newlane] = true;
				break;
			case BmsNote::NOTE_LNEND:
				isln[newlane] = false;
				break;
			}
			iscurrent[newlane] = true;
		}
		// copy
		for (int c = s; c <= e; c++) {
			lanes_[c].Delete(row);
			if (currentrow[c].type != BmsNote::NOTE_NONE) 
				lanes_[c].Set(row, currentrow[c]);
		}
		memcpy(isprev, iscurrent, sizeof(isprev));
	}
}